

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

ssize_t __thiscall
sznet::net::TcpConnection::send(TcpConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  EventLoop *this_00;
  bool bVar1;
  char *data;
  size_t len;
  TcpConnection *extraout_RAX;
  undefined4 in_register_00000034;
  undefined1 local_a8 [96];
  Functor local_48;
  code *local_28;
  offset_in_TcpConnection_to_subr fp;
  Buffer *local_18;
  Buffer *buf_local;
  TcpConnection *this_local;
  
  local_18 = (Buffer *)CONCAT44(in_register_00000034,__fd);
  if (this->m_state == kConnected) {
    buf_local = (Buffer *)this;
    bVar1 = EventLoop::isInLoopThread(this->m_loop);
    if (bVar1) {
      data = Buffer::peek(local_18);
      len = Buffer::readableBytes(local_18);
      sendInLoop(this,data,len);
      Buffer::retrieveAll(local_18);
      this = extraout_RAX;
    }
    else {
      local_28 = sendInLoop;
      fp = 0;
      this_00 = this->m_loop;
      local_a8._32_8_ = this;
      Buffer::retrieveAllAsString_abi_cxx11_((Buffer *)local_a8);
      std::
      bind<void(sznet::net::TcpConnection::*&)(sznet::StringPiece_const&),sznet::net::TcpConnection*,std::__cxx11::string>
                ((type *)(local_a8 + 0x28),(offset_in_TcpConnection_to_subr *)&local_28,
                 (TcpConnection **)(local_a8 + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
      std::function<void()>::
      function<std::_Bind<void(sznet::net::TcpConnection::*(sznet::net::TcpConnection*,std::__cxx11::string))(sznet::StringPiece_const&)>,void>
                ((function<void()> *)&local_48,
                 (_Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_sznet::StringPiece_&)>
                  *)(local_a8 + 0x28));
      EventLoop::runInLoop(this_00,&local_48);
      std::function<void_()>::~function(&local_48);
      std::
      _Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_sznet::StringPiece_&)>
      ::~_Bind((_Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_sznet::StringPiece_&)>
                *)(local_a8 + 0x28));
      this = (TcpConnection *)std::__cxx11::string::~string((string *)local_a8);
    }
  }
  return (ssize_t)this;
}

Assistant:

void TcpConnection::send(Buffer* buf)
{
	if (m_state == kConnected)
	{
		if (m_loop->isInLoopThread())
		{
			sendInLoop(buf->peek(), buf->readableBytes());
			buf->retrieveAll();
		}
		else
		{
			void (TcpConnection::*fp)(const StringPiece& message) = &TcpConnection::sendInLoop;
			// FIXME std::forward<string>(message)
			m_loop->runInLoop(std::bind(fp, this, buf->retrieveAllAsString()));
		}
	}
}